

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O2

void __thiscall NavierStokesBase::set_body_state(NavierStokesBase *this,MultiFab *S)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  int iVar7;
  int j;
  int j_00;
  int k;
  int k_00;
  AsyncArray<double,_0> body_state_lcl;
  Box local_1c4;
  Array4<double> local_1a8;
  Array4<int> local_168;
  int local_128;
  int local_124;
  double *local_120;
  Array4<int> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  if (!no_eb_in_domain) {
    if (!body_state_set) {
      define_body_state(this);
    }
    iVar1 = (S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    amrex::Gpu::AsyncArray<double,_0>::AsyncArray
              (&body_state_lcl,
               body_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,(long)iVar1);
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)S,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_1c4,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&S->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                (&local_110,&this->ebmask,&mfi);
      iVar6 = local_1c4.bigend.vect[2];
      iVar5 = local_1c4.bigend.vect[1];
      iVar4 = local_1c4.bigend.vect[0];
      iVar3 = local_1c4.smallend.vect[1];
      iVar2 = local_1c4.smallend.vect[0];
      local_120 = body_state_lcl.d_data;
      if (body_state_lcl.d_data == (double *)0x0) {
        local_120 = body_state_lcl.h_data;
      }
      local_1a8.end.z = local_d0.end.z;
      local_1a8.ncomp = local_d0.ncomp;
      local_1a8.begin.x = local_d0.begin.x;
      local_1a8.begin.y = local_d0.begin.y;
      local_1a8.kstride = local_d0.kstride;
      local_1a8.nstride = local_d0.nstride;
      local_1a8.p = local_d0.p;
      local_1a8.jstride = local_d0.jstride;
      local_168.end.z = local_110.end.z;
      local_168.ncomp = local_110.ncomp;
      local_168.begin.x = local_110.begin.x;
      local_168.begin.y = local_110.begin.y;
      local_168.kstride = local_110.kstride;
      local_168.nstride = local_110.nstride;
      local_168.p = local_110.p;
      local_168.jstride = local_110.jstride;
      local_124 = -1;
      iVar7 = local_1c4.bigend.vect[0] + 1;
      local_128 = iVar1;
      for (k_00 = local_1c4.smallend.vect[2]; j_00 = iVar3, k_00 <= iVar6; k_00 = k_00 + 1) {
        for (; j_00 <= iVar5; j_00 = j_00 + 1) {
          i = iVar2;
          if (iVar2 <= iVar4) {
            do {
              set_body_state_k(i,j_00,k_00,local_128,local_120,local_124,&local_168,&local_1a8);
              i = i + 1;
            } while (iVar7 != i);
          }
        }
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    amrex::Gpu::AsyncArray<double,_0>::~AsyncArray(&body_state_lcl);
  }
  return;
}

Assistant:

void
NavierStokesBase::set_body_state(MultiFab& S)
{
  if (no_eb_in_domain) return;

  if (!body_state_set)
  {
    define_body_state();
  }

  BL_ASSERT(S.nComp() == body_state.size());
  int nc = S.nComp();
  int covered_val = -1;

  // Need a GPU copy of body_state that's not a static attribute of the NSB class
  AsyncArray<amrex::Real> body_state_lcl(body_state.data(),nc);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
  {
    const Box& bx = mfi.tilebox();
    auto const& state = S.array(mfi);
    auto const& mask = ebmask.array(mfi);
    Real* state_lcl = body_state_lcl.data();
    amrex::ParallelFor(bx, [state,mask,nc,covered_val,state_lcl]
    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        set_body_state_k(i,j,k,nc,state_lcl,covered_val,mask,state);
    });
  }
}